

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

bool __thiscall QTreeView::isFirstColumnSpanned(QTreeView *this,int row,QModelIndex *parent)

{
  long lVar1;
  long *plVar2;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QPersistentModelIndex local_40;
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if ((*(long *)(lVar1 + 0x5f0) != 0) && (*(long *)(*(long *)(lVar1 + 0x5f0) + 8) != 0)) {
    plVar2 = *(long **)(lVar1 + 0x2f8);
    if (plVar2 != (long *)0x0) {
      local_38.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_38.r = -0x55555556;
      local_38.c = -0x55555556;
      local_38.i._0_4_ = 0xaaaaaaaa;
      local_38.i._4_4_ = 0xaaaaaaaa;
      bVar4 = false;
      (**(code **)(*plVar2 + 0x60))(&local_38,plVar2,row,0,parent);
      QPersistentModelIndex::QPersistentModelIndex(&local_40,&local_38);
      if (*(Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> **)(lVar1 + 0x5f0) !=
          (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
        pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                 findNode<QPersistentModelIndex>
                           (*(Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> **)
                             (lVar1 + 0x5f0),&local_40);
        bVar4 = pNVar3 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
      }
      QPersistentModelIndex::~QPersistentModelIndex(&local_40);
      goto LAB_005a8a65;
    }
  }
  bVar4 = false;
LAB_005a8a65:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeView::isFirstColumnSpanned(int row, const QModelIndex &parent) const
{
    Q_D(const QTreeView);
    if (d->spanningIndexes.isEmpty() || !d->model)
        return false;
    const QModelIndex index = d->model->index(row, 0, parent);
    return d->spanningIndexes.contains(index);
}